

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_none(archive_read *a,void **_buff,size_t *size,int64_t *offset)

{
  char cVar1;
  byte bVar2;
  void *pvVar3;
  long lVar4;
  wchar_t wVar5;
  uint8_t *data;
  ulong uVar6;
  undefined8 uVar7;
  size_t min;
  uint8_t *puVar8;
  undefined1 auVar9 [16];
  size_t dsize;
  ulong local_48;
  size_t *local_40;
  size_t local_38;
  
  pvVar3 = a->format->data;
  if ((*(byte *)(*(long *)((long)pvVar3 + 0x70) + 0x7e) & 8) == 0) {
    if (*(long *)((long)pvVar3 + 0x78) == 0) {
      *(undefined1 *)((long)pvVar3 + 0xa2) = 1;
      if (*(char *)((long)pvVar3 + 0x1ff0) == '\0') {
        return L'\0';
      }
      wVar5 = check_authentication_code(a,(void *)0x0);
      if (wVar5 == L'\0') {
        return L'\0';
      }
      return wVar5;
    }
    data = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_48);
    if ((long)local_48 < 1) {
LAB_00570d85:
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    uVar6 = *(ulong *)((long)pvVar3 + 0x78);
    if ((long)local_48 <= (long)*(ulong *)((long)pvVar3 + 0x78)) {
      uVar6 = local_48;
    }
  }
  else {
    min = 0x22;
    if (*(char *)((long)pvVar3 + 0x1ff0) == '\0') {
      min = 0x18;
    }
    local_40 = size;
    data = (uint8_t *)__archive_read_ahead(a,min,(ssize_t *)&local_48);
    if ((long)local_48 < (long)min) goto LAB_00570d85;
    cVar1 = *(char *)((long)pvVar3 + 0x1ff0);
    puVar8 = data + 10;
    if (cVar1 == '\0') {
      puVar8 = data;
    }
    if (((((*puVar8 == 'P') && (puVar8[1] == 'K')) && (puVar8[2] == '\a')) && (puVar8[3] == '\b'))
       && (((*(ulong *)((long)pvVar3 + 0x90) == (ulong)*(uint *)(puVar8 + 4) ||
            (*(char *)((long)pvVar3 + 0xa0) != '\0')) ||
           ((cVar1 != '\0' && (*(int *)(*(long *)((long)pvVar3 + 0x70) + 0x84) == 2)))))) {
      lVar4 = *(long *)((long)pvVar3 + 0x70);
      *(uint *)(lVar4 + 0x78) = *(uint *)(puVar8 + 4);
      if ((*(byte *)(lVar4 + 0x82) & 1) == 0) {
        *(ulong *)(lVar4 + 0x28) = (ulong)*(uint *)(puVar8 + 8);
        uVar6 = (ulong)*(uint *)(puVar8 + 0xc);
        uVar7 = 0x10;
      }
      else {
        if ((long)((ulong)(*(uint *)(puVar8 + 0xc) | *(uint *)(puVar8 + 0x14)) << 0x20) < 0) {
          archive_set_error(&a->archive,0x54,"Overflow of 64-bit file sizes");
          return L'\xffffffe7';
        }
        uVar6 = CONCAT44(*(uint *)(puVar8 + 0x14),*(undefined4 *)(puVar8 + 0x10));
        *(ulong *)(lVar4 + 0x28) = CONCAT44(*(uint *)(puVar8 + 0xc),*(undefined4 *)(puVar8 + 8));
        uVar7 = 0x18;
      }
      *(ulong *)(lVar4 + 0x30) = uVar6;
      *(undefined8 *)((long)pvVar3 + 0x68) = uVar7;
      if ((cVar1 != '\0') && (wVar5 = check_authentication_code(a,data), wVar5 != L'\0')) {
        return wVar5;
      }
      *(undefined1 *)((long)pvVar3 + 0xa2) = 1;
      return L'\0';
    }
    puVar8 = puVar8 + 1;
    while (puVar8 < data + (local_48 - 4)) {
      bVar2 = puVar8[3];
      if (bVar2 < 0x4b) {
        if (bVar2 == 7) {
          puVar8 = puVar8 + 1;
        }
        else {
          if ((((bVar2 == 8) && (puVar8[2] == '\a')) && (puVar8[1] == 'K')) && (*puVar8 == 'P')) {
            if (cVar1 != '\0') {
              puVar8 = puVar8 + -10;
            }
            break;
          }
LAB_00570f42:
          puVar8 = puVar8 + 4;
        }
      }
      else if (bVar2 == 0x50) {
        puVar8 = puVar8 + 3;
      }
      else {
        if (bVar2 != 0x4b) goto LAB_00570f42;
        puVar8 = puVar8 + 2;
      }
    }
    size = local_40;
    uVar6 = (long)puVar8 - (long)data;
  }
  local_48 = uVar6;
  uVar6 = local_48;
  if (*(char *)((long)pvVar3 + 0x1f84) == '\0') {
    if (*(char *)((long)pvVar3 + 0x1fe0) == '\0') goto LAB_00570ffa;
    if (*(ulong *)((long)pvVar3 + 0x1f60) <= local_48) {
      uVar6 = *(ulong *)((long)pvVar3 + 0x1f60);
    }
    local_38 = uVar6;
    __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 0x1fe8),data,uVar6);
    aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x1f88),data,uVar6,
                   *(uint8_t **)((long)pvVar3 + 0x1f50),&local_38);
  }
  else {
    if (*(ulong *)((long)pvVar3 + 0x1f60) <= local_48) {
      uVar6 = *(ulong *)((long)pvVar3 + 0x1f60);
    }
    trad_enc_decrypt_update
              ((trad_enc_ctx *)((long)pvVar3 + 0x1f78),data,uVar6,
               *(uint8_t **)((long)pvVar3 + 0x1f50),uVar6);
  }
  data = *(uint8_t **)((long)pvVar3 + 0x1f50);
  local_48 = uVar6;
LAB_00570ffa:
  *size = local_48;
  *(long *)((long)pvVar3 + 0x78) = *(long *)((long)pvVar3 + 0x78) - local_48;
  auVar9._8_4_ = (int)local_48;
  auVar9._0_8_ = local_48;
  auVar9._12_4_ = (int)(local_48 >> 0x20);
  *(ulong *)((long)pvVar3 + 0x80) = local_48 + *(long *)((long)pvVar3 + 0x80);
  *(long *)((long)pvVar3 + 0x88) = auVar9._8_8_ + *(long *)((long)pvVar3 + 0x88);
  *(long *)((long)pvVar3 + 0x68) = *(long *)((long)pvVar3 + 0x68) + local_48;
  *_buff = data;
  return L'\0';
}

Assistant:

static int
zip_read_data_none(struct archive_read *a, const void **_buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	const char *buff;
	ssize_t bytes_avail;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	if (zip->entry->zip_flags & ZIP_LENGTH_AT_END) {
		const char *p;
		ssize_t grabbing_bytes = 24;

		if (zip->hctx_valid)
			grabbing_bytes += AUTH_CODE_SIZE;
		/* Grab at least 24 bytes. */
		buff = __archive_read_ahead(a, grabbing_bytes, &bytes_avail);
		if (bytes_avail < grabbing_bytes) {
			/* Zip archives have end-of-archive markers
			   that are longer than this, so a failure to get at
			   least 24 bytes really does indicate a truncated
			   file. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		/* Check for a complete PK\007\010 signature, followed
		 * by the correct 4-byte CRC. */
		p = buff;
		if (zip->hctx_valid)
			p += AUTH_CODE_SIZE;
		if (p[0] == 'P' && p[1] == 'K'
		    && p[2] == '\007' && p[3] == '\010'
		    && (archive_le32dec(p + 4) == zip->entry_crc32
			|| zip->ignore_crc32
			|| (zip->hctx_valid
			 && zip->entry->aes_extra.vendor == AES_VENDOR_AE_2))) {
			if (zip->entry->flags & LA_USED_ZIP64) {
				uint64_t compressed, uncompressed;
				zip->entry->crc32 = archive_le32dec(p + 4);
				compressed = archive_le64dec(p + 8);
				uncompressed = archive_le64dec(p + 16);
				if (compressed > INT64_MAX || uncompressed >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Overflow of 64-bit file sizes");
					return ARCHIVE_FAILED;
				}
				zip->entry->compressed_size = compressed;
				zip->entry->uncompressed_size = uncompressed;
				zip->unconsumed = 24;
			} else {
				zip->entry->crc32 = archive_le32dec(p + 4);
				zip->entry->compressed_size =
					archive_le32dec(p + 8);
				zip->entry->uncompressed_size =
					archive_le32dec(p + 12);
				zip->unconsumed = 16;
			}
			if (zip->hctx_valid) {
				r = check_authentication_code(a, buff);
				if (r != ARCHIVE_OK)
					return (r);
			}
			zip->end_of_entry = 1;
			return (ARCHIVE_OK);
		}
		/* If not at EOF, ensure we consume at least one byte. */
		++p;

		/* Scan forward until we see where a PK\007\010 signature
		 * might be. */
		/* Return bytes up until that point.  On the next call,
		 * the code above will verify the data descriptor. */
		while (p < buff + bytes_avail - 4) {
			if (p[3] == 'P') { p += 3; }
			else if (p[3] == 'K') { p += 2; }
			else if (p[3] == '\007') { p += 1; }
			else if (p[3] == '\010' && p[2] == '\007'
			    && p[1] == 'K' && p[0] == 'P') {
				if (zip->hctx_valid)
					p -= AUTH_CODE_SIZE;
				break;
			} else { p += 4; }
		}
		bytes_avail = p - buff;
	} else {
		if (zip->entry_bytes_remaining == 0) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, NULL);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* Grab a bunch of bytes. */
		buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > zip->entry_bytes_remaining)
			bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (zip->tctx_valid || zip->cctx_valid) {
		size_t dec_size = bytes_avail;

		if (dec_size > zip->decrypted_buffer_size)
			dec_size = zip->decrypted_buffer_size;
		if (zip->tctx_valid) {
			trad_enc_decrypt_update(&zip->tctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, dec_size);
		} else {
			size_t dsize = dec_size;
			archive_hmac_sha1_update(&zip->hctx,
			    (const uint8_t *)buff, dec_size);
			archive_decrypto_aes_ctr_update(&zip->cctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, &dsize);
		}
		bytes_avail = dec_size;
		buff = (const char *)zip->decrypted_buffer;
	}
	*size = bytes_avail;
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_uncompressed_bytes_read += bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;
	zip->unconsumed += bytes_avail;
	*_buff = buff;
	return (ARCHIVE_OK);
}